

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O2

int get_filter_tap(InterpFilterParams *filter_params,int subpel_qn)

{
  int16_t *piVar1;
  int iVar2;
  ulong uVar3;
  
  if (filter_params->taps == 0xc) {
    iVar2 = 0xc;
  }
  else {
    piVar1 = filter_params->filter_ptr;
    uVar3 = (ulong)((subpel_qn & 0xfU) * (uint)filter_params->taps);
    if (piVar1[uVar3 + 7] == 0 && piVar1[uVar3] == 0) {
      if (piVar1[uVar3 + 6] == 0 && piVar1[uVar3 + 1] == 0) {
        return (uint)(piVar1[uVar3 + 5] != 0 || piVar1[uVar3 + 2] != 0) * 2 + 2;
      }
      iVar2 = 6;
    }
    else {
      iVar2 = 8;
    }
  }
  return iVar2;
}

Assistant:

static inline int get_filter_tap(const InterpFilterParams *const filter_params,
                                 int subpel_qn) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_qn & SUBPEL_MASK);
  if (filter_params->taps == 12) {
    return 12;
  }
  if (filter[0] | filter[7]) {
    return 8;
  }
  if (filter[1] | filter[6]) {
    return 6;
  }
#if CONFIG_SVT_AV1
  if (filter[2] | filter[5]) {
    return 4;
  }
  return 2;
#else
  return 4;
#endif
}